

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O1

void free_handshake_space(st_quicly_handshake_space_t **space)

{
  st_quicly_handshake_space_t *psVar1;
  ptls_aead_context_t *ppVar2;
  
  psVar1 = *space;
  if (psVar1 != (st_quicly_handshake_space_t *)0x0) {
    ppVar2 = (psVar1->cipher).ingress.aead;
    if (ppVar2 != (ptls_aead_context_t *)0x0) {
      ptls_aead_free(ppVar2);
      ptls_cipher_free((psVar1->cipher).ingress.header_protection);
    }
    psVar1 = *space;
    ppVar2 = (psVar1->cipher).egress.aead;
    if (ppVar2 != (ptls_aead_context_t *)0x0) {
      ptls_aead_free(ppVar2);
      ptls_cipher_free((psVar1->cipher).egress.header_protection);
    }
    do_free_pn_space(&(*space)->super);
    *space = (st_quicly_handshake_space_t *)0x0;
  }
  return;
}

Assistant:

static void free_handshake_space(struct st_quicly_handshake_space_t **space)
{
    if (*space != NULL) {
        if ((*space)->cipher.ingress.aead != NULL)
            dispose_cipher(&(*space)->cipher.ingress);
        if ((*space)->cipher.egress.aead != NULL)
            dispose_cipher(&(*space)->cipher.egress);
        do_free_pn_space(&(*space)->super);
        *space = NULL;
    }
}